

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O0

void init_uasmon(void)

{
  int local_c;
  int i;
  
  memcpy(&upermonst,mons + u.umonster,0x40);
  upermonst.mflags1 = mons[urace.malenum].mflags1 | upermonst.mflags1 & 0x9ffdffff;
  upermonst.mflags2 = mons[urace.malenum].mflags2 | upermonst.mflags2 & 0xbbfffff6;
  upermonst.mflags3 = upermonst.mflags3 & 0xfdff | mons[urace.malenum].mflags3;
  if (urace.malenum == 0xe8) {
    for (local_c = 0; local_c < 6; local_c = local_c + 1) {
      upermonst.mattk[local_c] =
           *(attack *)((long)urace.malenum * 0x40 + 0x3bfea0 + (long)local_c * 4);
    }
  }
  set_uasmon();
  return;
}

Assistant:

void init_uasmon(void)
{
	int i;

	upermonst = mons[u.umonster];

	/* Fix up the flags */
	/* Default flags assume human, so replace with your race's flags. */

	upermonst.mflags1 &= ~(mons[PM_HUMAN].mflags1);
	upermonst.mflags1 |= (mons[urace.malenum].mflags1);

	upermonst.mflags2 &= ~(mons[PM_HUMAN].mflags2);
	upermonst.mflags2 |= (mons[urace.malenum].mflags2);

	upermonst.mflags3 &= ~(mons[PM_HUMAN].mflags3);
	upermonst.mflags3 |= (mons[urace.malenum].mflags3);

	/* Fix up the attacks for vampires */
	/* This replaces the role's attacks with the vampire's race attacks. */
	if (Race_if(PM_VAMPIRE)) {
	    for (i = 0; i < NATTK; i++) {
		upermonst.mattk[i] = mons[urace.malenum].mattk[i];
	    }
	}

	set_uasmon();
}